

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O1

int32 model_def_free(model_def_t *mdef)

{
  uint32 *ptr;
  char **ppcVar1;
  acmod_set_t *paVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (mdef->acmod_set != (acmod_set_t *)0x0) {
    if (mdef->acmod_set->ci != (ci_acmod_t *)0x0) {
      paVar2 = mdef->acmod_set;
      if (paVar2->n_ci != 0) {
        uVar5 = 0;
        do {
          ckd_free(paVar2->ci[uVar5].name);
          if (mdef->acmod_set->ci[uVar5].attrib != (char **)0x0) {
            ppcVar1 = mdef->acmod_set->ci[uVar5].attrib;
            pcVar4 = *ppcVar1;
            if (pcVar4 != (char *)0x0) {
              uVar3 = 1;
              do {
                ckd_free(pcVar4);
                ppcVar1 = mdef->acmod_set->ci[uVar5].attrib;
                pcVar4 = ppcVar1[uVar3];
                uVar3 = (ulong)((int)uVar3 + 1);
              } while (pcVar4 != (char *)0x0);
            }
            ckd_free(ppcVar1);
          }
          uVar5 = uVar5 + 1;
          paVar2 = mdef->acmod_set;
        } while (uVar5 < paVar2->n_ci);
      }
      ckd_free(paVar2->ci);
    }
    paVar2 = mdef->acmod_set;
    paVar2->ci = (ci_acmod_t *)0x0;
    if (paVar2->multi != (acmod_t *)0x0) {
      paVar2 = mdef->acmod_set;
      if (paVar2->n_multi != 0) {
        uVar5 = 0;
        do {
          if (paVar2->multi[uVar5].attrib != (char **)0x0) {
            ppcVar1 = mdef->acmod_set->multi[uVar5].attrib;
            pcVar4 = *ppcVar1;
            if (pcVar4 != (char *)0x0) {
              uVar3 = 1;
              do {
                ckd_free(pcVar4);
                ppcVar1 = mdef->acmod_set->multi[uVar5].attrib;
                pcVar4 = ppcVar1[uVar3];
                uVar3 = (ulong)((int)uVar3 + 1);
              } while (pcVar4 != (char *)0x0);
            }
            ckd_free(ppcVar1);
          }
          uVar5 = uVar5 + 1;
          paVar2 = mdef->acmod_set;
        } while (uVar5 < paVar2->n_multi);
      }
      ckd_free(paVar2->multi);
    }
    paVar2 = mdef->acmod_set;
    paVar2->multi = (acmod_t *)0x0;
    if (paVar2->multi_idx != (itree_t **)0x0) {
      paVar2 = mdef->acmod_set;
      if (paVar2->n_ci != 0) {
        uVar5 = 0;
        do {
          ckd_free(paVar2->multi_idx[uVar5]->cell);
          ckd_free(mdef->acmod_set->multi_idx[uVar5]);
          uVar5 = uVar5 + 1;
          paVar2 = mdef->acmod_set;
        } while (uVar5 < paVar2->n_ci);
      }
      ckd_free(paVar2->multi_idx);
    }
    paVar2 = mdef->acmod_set;
    paVar2->multi_idx = (itree_t **)0x0;
    if (paVar2->attrib != (char **)0x0) {
      ppcVar1 = mdef->acmod_set->attrib;
      pcVar4 = *ppcVar1;
      if (pcVar4 != (char *)0x0) {
        uVar5 = 1;
        do {
          ckd_free(pcVar4);
          ppcVar1 = mdef->acmod_set->attrib;
          pcVar4 = ppcVar1[uVar5];
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (pcVar4 != (char *)0x0);
      }
      ckd_free(ppcVar1);
    }
    paVar2 = mdef->acmod_set;
    paVar2->attrib = (char **)0x0;
    ptr = paVar2->n_with;
    if (ptr != (uint32 *)0x0) {
      ckd_free(ptr);
    }
    mdef->acmod_set->n_with = (uint32 *)0x0;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = (acmod_set_t *)0x0;
  if (mdef->defn != (model_def_entry_t *)0x0) {
    ckd_free(mdef->defn->state);
    if (mdef->n_defn != 0) {
      uVar5 = 0;
      do {
        if (mdef->defn[uVar5].attrib != (char **)0x0) {
          ppcVar1 = mdef->defn[uVar5].attrib;
          pcVar4 = *ppcVar1;
          if (pcVar4 != (char *)0x0) {
            uVar3 = 1;
            do {
              ckd_free(pcVar4);
              ppcVar1 = mdef->defn[uVar5].attrib;
              pcVar4 = ppcVar1[uVar3];
              uVar3 = (ulong)((int)uVar3 + 1);
            } while (pcVar4 != (char *)0x0);
          }
          ckd_free(ppcVar1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < mdef->n_defn);
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = (model_def_entry_t *)0x0;
  if (mdef->cb != (uint32 *)0x0) {
    ckd_free(mdef->cb);
  }
  mdef->cb = (uint32 *)0x0;
  if (mdef->ts2ci != (acmod_id_t *)0x0) {
    ckd_free(mdef->ts2ci);
  }
  mdef->ts2ci = (acmod_id_t *)0x0;
  ckd_free(mdef);
  return 0;
}

Assistant:

int32
model_def_free(model_def_t *mdef)
{
  uint32 i;
  uint32 len;

  if (mdef->acmod_set) {
    if (mdef->acmod_set->ci) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->ci[i].name);
	if (mdef->acmod_set->ci[i].attrib) {
	  for (len = 0; mdef->acmod_set->ci[i].attrib[len]; len++)
    	     ckd_free(mdef->acmod_set->ci[i].attrib[len]);
	  ckd_free(mdef->acmod_set->ci[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->ci);
    }
    mdef->acmod_set->ci = NULL;

    if (mdef->acmod_set->multi) {
      for (i = 0; i < mdef->acmod_set->n_multi; i ++) {
	if (mdef->acmod_set->multi[i].attrib) {
	  for (len = 0; mdef->acmod_set->multi[i].attrib[len]; len++)
	     ckd_free(mdef->acmod_set->multi[i].attrib[len]);
	  ckd_free(mdef->acmod_set->multi[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->multi);
    }
    mdef->acmod_set->multi = NULL;

    if (mdef->acmod_set->multi_idx) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->multi_idx[i]->cell);
	ckd_free(mdef->acmod_set->multi_idx[i]);
      }
      ckd_free(mdef->acmod_set->multi_idx);
    }
    mdef->acmod_set->multi_idx = NULL;

    if (mdef->acmod_set->attrib) {
      for (len = 0; mdef->acmod_set->attrib[len]; len++)
	  ckd_free(mdef->acmod_set->attrib[len]);
      ckd_free(mdef->acmod_set->attrib);
    }
    mdef->acmod_set->attrib = NULL;

    if (mdef->acmod_set->n_with)
      ckd_free(mdef->acmod_set->n_with);
    mdef->acmod_set->n_with = NULL;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = NULL;

  if (mdef->defn) {
    ckd_free(mdef->defn->state);
    for (i = 0; i < mdef->n_defn; i++) {
      if (mdef->defn[i].attrib) {
	for (len = 0; mdef->defn[i].attrib[len]; len++)
	    ckd_free(mdef->defn[i].attrib[len]);
	ckd_free(mdef->defn[i].attrib);
      }
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = NULL;

  if (mdef->cb)
    ckd_free(mdef->cb);
  mdef->cb = NULL;

  if (mdef->ts2ci)
    ckd_free(mdef->ts2ci);
  mdef->ts2ci = NULL;

  ckd_free(mdef);
  mdef = NULL;

  return S3_SUCCESS;
}